

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O1

string * __thiscall
punky::ast::IfExpression::to_string_abi_cxx11_(string *__return_storage_ptr__,IfExpression *this)

{
  size_type *psVar1;
  undefined8 uVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  long *local_c8;
  undefined8 local_c0;
  long local_b8;
  undefined8 uStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  string local_48;
  
  if (((this->m_condition)._M_t.
       super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>._M_t.
       super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>.
       super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl == (ExprNode *)0x0) ||
     ((this->m_consequence)._M_t.
      super___uniq_ptr_impl<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>._M_t
      .super__Tuple_impl<0UL,_punky::ast::BlockStmt_*,_std::default_delete<punky::ast::BlockStmt>_>.
      super__Head_base<0UL,_punky::ast::BlockStmt_*,_false>._M_head_impl == (BlockStmt *)0x0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  ExprNode::token_literal_abi_cxx11_(&local_48,&this->super_ExprNode);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_48);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_98 = *puVar5;
    uStack_90 = (undefined4)plVar3[3];
    uStack_8c = *(undefined4 *)((long)plVar3 + 0x1c);
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar5;
    local_a8 = (ulong *)*plVar3;
  }
  local_a0 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  (*(((this->m_condition)._M_t.
      super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>._M_t.
      super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>.
      super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl)->super_AstNode).
    _vptr_AstNode[3])(&local_68);
  uVar6 = 0xf;
  if (local_a8 != &local_98) {
    uVar6 = local_98;
  }
  if (uVar6 < (ulong)(local_60 + local_a0)) {
    uVar6 = 0xf;
    if (local_68 != local_58) {
      uVar6 = local_58[0];
    }
    if (uVar6 < (ulong)(local_60 + local_a0)) goto LAB_0010a8d8;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_a8);
  }
  else {
LAB_0010a8d8:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_68);
  }
  local_c8 = &local_b8;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_b8 = *plVar3;
    uStack_b0 = puVar4[3];
  }
  else {
    local_b8 = *plVar3;
    local_c8 = (long *)*puVar4;
  }
  local_c0 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
  puVar5 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar5) {
    local_d8 = *puVar5;
    lStack_d0 = plVar3[3];
    local_e8 = &local_d8;
  }
  else {
    local_d8 = *puVar5;
    local_e8 = (ulong *)*plVar3;
  }
  local_e0 = plVar3[1];
  *plVar3 = (long)puVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  (**(code **)(*(long *)&(((this->m_consequence)._M_t.
                           super___uniq_ptr_impl<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_punky::ast::BlockStmt_*,_std::default_delete<punky::ast::BlockStmt>_>
                           .super__Head_base<0UL,_punky::ast::BlockStmt_*,_false>._M_head_impl)->
                         super_StmtNode).super_AstNode + 0x18))(&local_88);
  uVar6 = 0xf;
  if (local_e8 != &local_d8) {
    uVar6 = local_d8;
  }
  if (uVar6 < (ulong)(local_80 + local_e0)) {
    uVar6 = 0xf;
    if (local_88 != local_78) {
      uVar6 = local_78[0];
    }
    if ((ulong)(local_80 + local_e0) <= uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_e8);
      goto LAB_0010aa08;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_88);
LAB_0010aa08:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar2 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((this->m_alternative).
      super__Optional_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
      ._M_engaged == true) {
    (**(code **)(*(long *)(this->m_alternative).
                          super__Optional_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
                          ._M_payload + 0x18))(&local_c8);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x119661);
    puVar5 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar5) {
      local_d8 = *puVar5;
      lStack_d0 = plVar3[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *puVar5;
      local_e8 = (ulong *)*plVar3;
    }
    local_e0 = plVar3[1];
    *plVar3 = (long)puVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_e8);
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string IfExpression::to_string() const
{
    if (m_condition && m_consequence)
    {
        std::string if_str{token_literal() + " " + m_condition->to_string()
                           + " " + m_consequence->to_string()};
        if (m_alternative.has_value())
            if_str.append("else " + m_alternative.value()->to_string());
        return if_str;
    }
    return "";
}